

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV8R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  RepeatedField<bool> *this;
  ulong uVar8;
  uint *puVar9;
  char *pcVar10;
  TcFieldData TVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined7 uVar13;
  undefined8 extraout_RDX_00;
  ushort *puVar14;
  
  if (data.field_0._0_2_ != 0) {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  pcVar10 = (char *)((ulong)data.field_0 >> 0x30);
  this = RefAt<google::protobuf::RepeatedField<bool>>(msg,(size_t)pcVar10);
  uVar3 = *(ushort *)ptr;
  uVar12 = extraout_RDX;
  while( true ) {
    puVar14 = (ushort *)((long)ptr + 3);
    bVar1 = (byte)*(ushort *)((long)ptr + 2);
    uVar13 = (undefined7)((ulong)uVar12 >> 8);
    uVar7 = (uint)CONCAT71(uVar13,bVar1);
    if (1 < bVar1) {
      bVar5 = 1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)((long)ptr + 3);
        TVar11.field_0._1_7_ = (undefined7)((ulong)puVar14 >> 8);
        bVar5 = bVar1 & 0x7f | bVar2;
        if ((char)bVar2 < '\0') {
          bVar6 = bVar1 & 0x7f | bVar2 & 0x7f;
          bVar2 = (byte)*(ushort *)((long)ptr + 4);
          bVar5 = bVar6 | bVar2;
          if ((char)bVar2 < '\0') {
            bVar6 = bVar6 | bVar2 & 0x7f;
            bVar2 = *(byte *)((long)ptr + 5);
            bVar5 = bVar6 | bVar2;
            if ((char)bVar2 < '\0') {
              bVar6 = bVar6 | bVar2 & 0x7f;
              bVar2 = (byte)*(ushort *)((long)ptr + 6);
              bVar5 = bVar6 | bVar2;
              if ((char)bVar2 < '\0') {
                bVar6 = bVar6 | bVar2 & 0x7f;
                bVar2 = *(byte *)((long)ptr + 7);
                bVar5 = bVar6 | bVar2;
                if ((char)bVar2 < '\0') {
                  bVar6 = bVar6 | bVar2 & 0x7f;
                  bVar2 = (byte)*(ushort *)((long)ptr + 8);
                  bVar5 = bVar6 | bVar2;
                  if ((char)bVar2 < '\0') {
                    bVar6 = bVar6 | bVar2 & 0x7f;
                    bVar2 = *(byte *)((long)ptr + 9);
                    bVar5 = bVar6 | bVar2;
                    if ((char)bVar2 < '\0') {
                      bVar6 = bVar6 | bVar2 & 0x7f;
                      bVar2 = (byte)*(ushort *)((long)ptr + 10);
                      bVar5 = bVar6 | bVar2;
                      if ((char)bVar2 < '\0') {
                        bVar5 = *(byte *)((long)ptr + 0xb);
                        TVar11.field_0.data._0_1_ = bVar5;
                        if ((char)bVar5 < '\0') {
                          pcVar10 = Error(msg,pcVar10,
                                          (ParseContext *)
                                          (CONCAT71(uVar13,bVar1) & 0xffffffffffffff7f),TVar11,table
                                          ,hasbits);
                          return pcVar10;
                        }
                        puVar14 = (ushort *)((long)ptr + 0xc);
                        bVar5 = bVar6 | bVar2 & 0x7f | bVar5 & 0x81;
                      }
                      else {
                        puVar14 = (ushort *)((long)ptr + 0xb);
                      }
                    }
                    else {
                      puVar14 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar14 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar14 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar14 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar14 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar14 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar14 = (ushort *)((long)ptr + 4);
        }
      }
      uVar7 = (uint)(bVar5 != 0);
    }
    pcVar10 = (char *)(ulong)(uVar7 & 1);
    RepeatedField<bool>::Add(this,SUB41(uVar7 & 1,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar14) break;
    uVar4 = *puVar14;
    uVar12 = extraout_RDX_00;
    ptr = (char *)puVar14;
    if (uVar4 != uVar3) {
      uVar7 = (uint)table->fast_idx_mask & (uint)uVar4;
      if ((uVar7 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar8 = (ulong)(uVar7 & 0xfffffff8);
      pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                  (msg,puVar14,ctx,
                                   (ulong)uVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),
                                   table,hasbits);
      return pcVar10;
    }
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar9 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar9 = *puVar9 | (uint)hasbits;
  }
  return (char *)puVar14;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}